

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_ssprk.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  sunrealtype u;
  sunrealtype lambda;
  sunrealtype *rdata;
  
  dVar1 = *in_RDX;
  pdVar3 = (double *)N_VGetArrayPointer(in_RDI);
  dVar2 = *pdVar3;
  dVar4 = atan(in_XMM0_Qa);
  pdVar3 = (double *)N_VGetArrayPointer(in_RSI);
  *pdVar3 = -dVar1 * dVar4 + dVar1 * dVar2 + 1.0 / (in_XMM0_Qa * in_XMM0_Qa + 1.0);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype u = N_VGetArrayPointer(y)[0]; /* access current solution value */

  /* fill in the RHS function: "N_VGetArrayPointer" accesses the 0th entry of ydot */
  N_VGetArrayPointer(ydot)[0] =
    lambda * u + SUN_RCONST(1.0) / (SUN_RCONST(1.0) + t * t) - lambda * ATAN(t);

  return 0; /* return with success */
}